

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSession::Create
          (RTPSession *this,RTPSessionParams *sessparams,RTPTransmitter *transmitter)

{
  bool bVar1;
  size_t sVar2;
  int status;
  RTPTransmitter *transmitter_local;
  RTPSessionParams *sessparams_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    bVar1 = RTPSessionParams::IsUsingPollThread(sessparams);
    this->usingpollthread = bVar1;
    bVar1 = RTPSessionParams::NeedThreadSafety(sessparams);
    this->needthreadsafety = bVar1;
    if (((this->usingpollthread & 1U) == 0) || ((this->needthreadsafety & 1U) != 0)) {
      bVar1 = RTPSessionParams::GetSenderReportForBYE(sessparams);
      this->useSR_BYEifpossible = bVar1;
      this->sentpackets = false;
      sVar2 = RTPSessionParams::GetMaximumPacketSize(sessparams);
      this->maxpacksize = sVar2;
      if (sVar2 < 600) {
        this_local._4_4_ = -0x3d;
      }
      else {
        this->rtptrans = transmitter;
        this_local._4_4_ =
             (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1e])
                       (this->rtptrans,this->maxpacksize);
        if (-1 < this_local._4_4_) {
          this->deletetransmitter = false;
          this_local._4_4_ = InternalCreate(this,sessparams);
        }
      }
    }
    else {
      this_local._4_4_ = -0xb1;
    }
  }
  else {
    this_local._4_4_ = -0x3a;
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::Create(const RTPSessionParams &sessparams,RTPTransmitter *transmitter)
{
	int status;
	
	if (created)
		return ERR_RTP_SESSION_ALREADYCREATED;

	usingpollthread = sessparams.IsUsingPollThread();
	needthreadsafety = sessparams.NeedThreadSafety();
	if (usingpollthread && !needthreadsafety)
		return ERR_RTP_SESSION_THREADSAFETYCONFLICT;

	useSR_BYEifpossible = sessparams.GetSenderReportForBYE();
	sentpackets = false;
	
	// Check max packet size
	
	if ((maxpacksize = sessparams.GetMaximumPacketSize()) < RTP_MINPACKETSIZE)
		return ERR_RTP_SESSION_MAXPACKETSIZETOOSMALL;
		
	rtptrans = transmitter;

	if ((status = rtptrans->SetMaximumPacketSize(maxpacksize)) < 0)
		return status;

	deletetransmitter = false;
	return InternalCreate(sessparams);
}